

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O2

void msd_D<vector_block<unsigned_char*,1024u>,unsigned_short>
               (uchar **strings,size_t n,size_t depth,vector_block<unsigned_char_*,_1024U> *buckets)

{
  ushort uVar1;
  uint j;
  long lVar2;
  vector_block<unsigned_char_*,_1024U> *pvVar3;
  uchar **t;
  uint j_1;
  ulong n_00;
  uint i_2;
  uchar **t_00;
  uint i_1;
  ulong uVar4;
  long lVar5;
  array<unsigned_short,_256UL> bucketsize;
  
  if (n < 0x20) {
    insertion_sort(strings,(int)n,depth);
    return;
  }
  t_00 = strings;
  for (uVar4 = 0; uVar4 < (n & 0xffffffffffffffe0); uVar4 = uVar4 + 0x20) {
    for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
      *(uchar *)((long)bucketsize._M_elems + lVar2) = t_00[lVar2][depth];
    }
    t = t_00;
    for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
      vector_block<unsigned_char_*,_1024U>::push_back
                (buckets + *(byte *)((long)bucketsize._M_elems + lVar2),t);
      t = t + 1;
    }
    t_00 = t_00 + 0x20;
  }
  for (; uVar4 < n; uVar4 = uVar4 + 1) {
    vector_block<unsigned_char_*,_1024U>::push_back(buckets + (*t_00)[depth],t_00);
    t_00 = t_00 + 1;
  }
  pvVar3 = buckets;
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    bucketsize._M_elems[lVar2] =
         ((short)*(undefined4 *)
                  &(pvVar3->_index_block).
                   super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   super__Vector_impl_data._M_finish -
         (short)*(undefined4 *)
                 &(pvVar3->_index_block).
                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  super__Vector_impl_data._M_start) * 0x80 - (short)pvVar3->_left_in_block;
    pvVar3 = pvVar3 + 1;
  }
  lVar2 = 0;
  pvVar3 = buckets;
  for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
    uVar1 = bucketsize._M_elems[lVar5];
    if ((ulong)uVar1 != 0) {
      copy<unsigned_char*,1024u,unsigned_char**>(pvVar3,strings + lVar2);
      lVar2 = lVar2 + (ulong)uVar1;
    }
    pvVar3 = pvVar3 + 1;
  }
  for (lVar2 = 0; lVar2 != 0x2800; lVar2 = lVar2 + 0x28) {
    vector_block<unsigned_char_*,_1024U>::clear
              ((vector_block<unsigned_char_*,_1024U> *)
               ((long)&(buckets->_index_block).
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar2));
  }
  uVar4 = (ulong)bucketsize._M_elems[0];
  for (lVar2 = 1; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    n_00 = (ulong)bucketsize._M_elems[lVar2];
    if (n_00 != 0) {
      msd_D<vector_block<unsigned_char*,1024u>,unsigned_short>
                (strings + uVar4,n_00,depth + 1,buckets);
      uVar4 = uVar4 + n_00;
    }
  }
  return;
}

Assistant:

static void
msd_D(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j < 32; ++j) {
			cache[j] = strings[i+j][depth];
		}
		for (unsigned j=0; j < 32; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		buckets[strings[i][depth]].push_back(strings[i]);
	}
	std::array<BucketsizeType, 256> bucketsize;
	for (unsigned i=0; i < 256; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 256; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_D<Bucket, BucketsizeType>(strings+pos, bucketsize[i], depth+1, buckets);
		pos += bucketsize[i];
	}
}